

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.h
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityKirchhoffOrthotropic::~ChElasticityKirchhoffOrthotropic
          (ChElasticityKirchhoffOrthotropic *this)

{
  ::operator_delete(this,0x30);
  return;
}

Assistant:

class ChApi ChElasticityKirchhoffOrthotropic : public ChElasticityKirchhoff {
  public:
    /// Construct an orthotropic material
    ChElasticityKirchhoffOrthotropic  (double m_E_x,    ///< Young's modulus on x
                                       double m_E_y,    ///< Young's modulus on y
                                       double m_nu_xy,  ///< Poisson ratio xy (for yx it holds: nu_yx*E_x = nu_xy*E_y)
                                       double m_G_xy    ///< Shear modulus, in plane
    );
    /// Construct an orthotropic material as sub case isotropic
    ChElasticityKirchhoffOrthotropic  (double m_E,            ///< Young's modulus on x
                                       double m_nu            ///< Poisson ratio
    );

    /// Return the elasticity moduli, on x
    double Get_E_x() const { return E_x; }
    /// Return the elasticity moduli, on y
    double Get_E_y() const { return E_y; }
    /// Return the Poisson ratio, for xy
    double Get_nu_xy() const { return nu_xy; }
    /// Return the Poisson ratio, for yx (follows xy as it must be nu_yx*E_x = nu_xy*E_y)
    double Get_nu_yx() const { return nu_xy * (E_y / E_x); }
    /// Return the shear mod, in plane
    double Get_G_xy() const { return G_xy; }

    /// The FE code will evaluate this function to compute
    /// per-unit-length forces/torques given the strains/curvatures.
    virtual void ComputeStress(
        ChVector<>& n,            ///< forces  n_11, n_22, n_12 (per unit length)
        ChVector<>& m,            ///< torques m_11, m_22, m_12 (per unit length)
        const ChVector<>& eps,    ///< strains   e_11, e_22, e_12
        const ChVector<>& kur,    ///< curvature k_11, k_22, k_12
        const double z_inf,       ///< layer lower z value (along thickness coord)
        const double z_sup,       ///< layer upper z value (along thickness coord)
        const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
    ) override;

    /// Compute 6x6 stiffness matrix [Km] , that is [ds/de], the tangent of the constitutive relation
    /// per-unit-length forces/torques vs generalized strains.
    virtual void ComputeStiffnessMatrix(
        ChMatrixRef mC,           ///< tangent matrix
        const ChVector<>& eps,    ///< strains   e_11, e_22, e_12
        const ChVector<>& kur,    ///< curvature k_11, k_22, k_12
        const double z_inf,       ///< layer lower z value (along thickness coord)
        const double z_sup,       ///< layer upper z value (along thickness coord)
        const double angle        ///< layer angle respect to x (if needed)
    ) override;

  private:
    double E_x;    ///< elasticity moduli
    double E_y;    ///< elasticity moduli
    double nu_xy;  ///< Poisson ratio
    double G_xy;   ///< Shear factor, in plane
    ////double G_xz;   ///< Shear factor, out of plane
    ////double G_yz;   ///< Shear factor, out of plane
}